

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack16to4.h
# Opt level: O0

void ncnn::deconvolution_pack16to4_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  int iVar107;
  int iVar108;
  undefined8 *puVar109;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar114 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _wf;
  __m128 _we;
  __m128 _wd;
  __m128 _wc;
  __m128 _wb;
  __m128 _wa;
  __m128 _w9;
  __m128 _w8;
  __m128 _w7;
  __m128 _w6;
  __m128 _w5;
  __m128 _w4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _valf;
  __m128 _vale;
  __m128 _vald;
  __m128 _valc;
  __m128 _valb;
  __m128 _vala;
  __m128 _val9;
  __m128 _val8;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  undefined8 local_2958;
  undefined8 uStack_2950;
  int local_24c8;
  int local_24bc;
  int local_246c;
  long local_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  int local_2404;
  int local_2400;
  undefined8 *local_2390;
  int local_2384;
  undefined1 local_1ab8 [8];
  undefined8 uStack_1ab0;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  float local_16f8;
  float fStack_16f4;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  float local_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float fStack_16a0;
  float fStack_169c;
  float local_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  undefined1 local_1648 [16];
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined1 local_15f8 [8];
  float fStack_15f0;
  float fStack_15ec;
  float local_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float local_1548;
  float fStack_1544;
  float fStack_1540;
  float fStack_153c;
  float local_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float local_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  undefined1 local_14d8 [16];
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined1 local_1488 [8];
  float fStack_1480;
  float fStack_147c;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  float local_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined1 local_b68 [16];
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined1 local_b18 [8];
  float fStack_b10;
  float fStack_b0c;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined1 local_678 [8];
  float fStack_670;
  float fStack_66c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined1 local_5f8 [8];
  undefined8 uStack_5f0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  
  lVar103 = in_RSI[7];
  lVar5 = *in_RCX;
  for (local_2384 = 0; local_2384 < (int)lVar103; local_2384 = local_2384 + 1) {
    local_2390 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_2384 * in_RSI[2]);
    iVar3 = *(int *)((long)in_RDI + 0x2c);
    lVar104 = in_RDI[6];
    lVar105 = in_RDI[7];
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar106 = in_RSI[6];
    for (local_2400 = 0; local_2400 < (int)lVar106; local_2400 = local_2400 + 1) {
      for (local_2404 = 0; local_2404 < iVar4; local_2404 = local_2404 + 1) {
        local_2418 = 0;
        uStack_2410 = 0;
        if (lVar5 != 0) {
          puVar109 = (undefined8 *)(lVar5 + (long)(local_2384 << 2) * 4);
          local_2418 = *puVar109;
          uStack_2410 = puVar109[1];
        }
        local_2420 = *in_RDX + in_RDX[8] * (long)local_2384 * in_RDX[2];
        for (local_246c = 0; local_246c < (int)lVar105; local_246c = local_246c + 1) {
          for (local_24bc = 0; local_24bc < in_R9D; local_24bc = local_24bc + 1) {
            iVar107 = (local_2400 + local_24bc * in_stack_00000010) -
                      in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar107) && (iVar107 % in_stack_00000020 == 0)) &&
               (iVar107 / in_stack_00000020 < (int)lVar104)) {
              for (local_24c8 = 0; local_24c8 < in_R8D; local_24c8 = local_24c8 + 1) {
                iVar108 = (local_2404 + local_24c8 * in_stack_00000008) -
                          in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar108) && (iVar108 % in_stack_00000018 == 0)) &&
                   (iVar108 / in_stack_00000018 < iVar3)) {
                  puVar1 = (undefined4 *)
                           (*in_RDI + in_RDI[8] * (long)local_246c * in_RDI[2] +
                            (long)*(int *)((long)in_RDI + 0x2c) *
                            (long)(iVar107 / in_stack_00000020) * in_RDI[2] +
                           (long)(iVar108 / in_stack_00000018 << 4) * 4);
                  iVar108 = (local_24bc * in_R8D + local_24c8) * 0x40;
                  uVar2 = *puVar1;
                  auVar22._4_4_ = uVar2;
                  auVar22._0_4_ = uVar2;
                  auVar22._12_4_ = uVar2;
                  auVar22._8_4_ = uVar2;
                  uVar2 = puVar1[1];
                  auVar21._4_4_ = uVar2;
                  auVar21._0_4_ = uVar2;
                  auVar21._12_4_ = uVar2;
                  auVar21._8_4_ = uVar2;
                  uVar2 = puVar1[2];
                  auVar20._4_4_ = uVar2;
                  auVar20._0_4_ = uVar2;
                  auVar20._12_4_ = uVar2;
                  auVar20._8_4_ = uVar2;
                  uVar2 = puVar1[3];
                  auVar19._4_4_ = uVar2;
                  auVar19._0_4_ = uVar2;
                  auVar19._12_4_ = uVar2;
                  auVar19._8_4_ = uVar2;
                  uVar2 = puVar1[4];
                  auVar18._4_4_ = uVar2;
                  auVar18._0_4_ = uVar2;
                  auVar18._12_4_ = uVar2;
                  auVar18._8_4_ = uVar2;
                  uVar2 = puVar1[5];
                  auVar17._4_4_ = uVar2;
                  auVar17._0_4_ = uVar2;
                  auVar17._12_4_ = uVar2;
                  auVar17._8_4_ = uVar2;
                  uVar2 = puVar1[6];
                  auVar16._4_4_ = uVar2;
                  auVar16._0_4_ = uVar2;
                  auVar16._12_4_ = uVar2;
                  auVar16._8_4_ = uVar2;
                  uVar2 = puVar1[7];
                  auVar15._4_4_ = uVar2;
                  auVar15._0_4_ = uVar2;
                  auVar15._12_4_ = uVar2;
                  auVar15._8_4_ = uVar2;
                  uVar2 = puVar1[8];
                  auVar14._4_4_ = uVar2;
                  auVar14._0_4_ = uVar2;
                  auVar14._12_4_ = uVar2;
                  auVar14._8_4_ = uVar2;
                  uVar2 = puVar1[9];
                  auVar13._4_4_ = uVar2;
                  auVar13._0_4_ = uVar2;
                  auVar13._12_4_ = uVar2;
                  auVar13._8_4_ = uVar2;
                  uVar2 = puVar1[10];
                  auVar12._4_4_ = uVar2;
                  auVar12._0_4_ = uVar2;
                  auVar12._12_4_ = uVar2;
                  auVar12._8_4_ = uVar2;
                  uVar2 = puVar1[0xb];
                  auVar11._4_4_ = uVar2;
                  auVar11._0_4_ = uVar2;
                  auVar11._12_4_ = uVar2;
                  auVar11._8_4_ = uVar2;
                  uVar2 = puVar1[0xc];
                  auVar10._4_4_ = uVar2;
                  auVar10._0_4_ = uVar2;
                  auVar10._12_4_ = uVar2;
                  auVar10._8_4_ = uVar2;
                  uVar2 = puVar1[0xd];
                  auVar8._4_4_ = uVar2;
                  auVar8._0_4_ = uVar2;
                  auVar8._12_4_ = uVar2;
                  auVar8._8_4_ = uVar2;
                  uVar2 = puVar1[0xe];
                  auVar7._4_4_ = uVar2;
                  auVar7._0_4_ = uVar2;
                  auVar7._12_4_ = uVar2;
                  auVar7._8_4_ = uVar2;
                  uVar2 = puVar1[0xf];
                  auVar6._4_4_ = uVar2;
                  auVar6._0_4_ = uVar2;
                  auVar6._12_4_ = uVar2;
                  auVar6._8_4_ = uVar2;
                  auVar9._8_8_ = uStack_2410;
                  auVar9._0_8_ = local_2418;
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2420 + (long)iVar108 * 4),
                                           auVar22,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x10),auVar21,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x20),auVar20,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x30),auVar19,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x40),auVar18,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x50),auVar17,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x60),auVar16,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x70),auVar15,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x80),auVar14,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0x90),auVar13,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0xa0),auVar12,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0xb0),auVar11,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0xc0),auVar10,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0xd0),auVar8,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0xe0),auVar7,auVar9);
                  auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (local_2420 + (long)iVar108 * 4 + 0xf0),auVar6,auVar9);
                  local_2958 = auVar9._0_8_;
                  uStack_2950 = auVar9._8_8_;
                  local_2418 = local_2958;
                  uStack_2410 = uStack_2950;
                }
              }
            }
          }
          local_2420 = local_2420 + (long)(in_R8D * in_R9D * 0x40) * 4;
        }
        fStack_16a0 = (float)uStack_2410;
        fStack_169c = (float)((ulong)uStack_2410 >> 0x20);
        local_16f8 = (float)local_2418;
        fStack_16f4 = (float)((ulong)local_2418 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          auVar23._8_8_ = uStack_2410;
          auVar23._0_8_ = local_2418;
          _local_1ab8 = vmaxps_avx(auVar23,ZEXT816(0));
          break;
        case 2:
          fVar110 = *(float *)*in_stack_00000030;
          auVar26._8_8_ = uStack_2410;
          auVar26._0_8_ = local_2418;
          auVar9 = vmaxps_avx(ZEXT816(0),auVar26);
          auVar27._8_8_ = uStack_2410;
          auVar27._0_8_ = local_2418;
          auVar6 = vminps_avx(ZEXT816(0),auVar27);
          local_1698 = auVar6._0_4_;
          fStack_1694 = auVar6._4_4_;
          fStack_1690 = auVar6._8_4_;
          fStack_168c = auVar6._12_4_;
          local_1998 = auVar9._0_4_;
          fStack_1994 = auVar9._4_4_;
          fStack_1990 = auVar9._8_4_;
          fStack_198c = auVar9._12_4_;
          local_1ab8._4_4_ = fStack_1994 + fVar110 * fStack_1694;
          local_1ab8._0_4_ = local_1998 + fVar110 * local_1698;
          uStack_1ab0._0_4_ = fStack_1990 + fVar110 * fStack_1690;
          uStack_1ab0._4_4_ = fStack_198c + fVar110 * fStack_168c;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000030;
          auVar24._4_4_ = uVar2;
          auVar24._0_4_ = uVar2;
          auVar24._12_4_ = uVar2;
          auVar24._8_4_ = uVar2;
          uVar2 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar28._4_4_ = uVar2;
          auVar28._0_4_ = uVar2;
          auVar28._12_4_ = uVar2;
          auVar28._8_4_ = uVar2;
          auVar25._8_8_ = uStack_2410;
          auVar25._0_8_ = local_2418;
          auVar9 = vmaxps_avx(auVar25,auVar24);
          _local_1ab8 = vminps_avx(auVar9,auVar28);
          break;
        case 4:
          auVar29._8_8_ = 0x3f8000003f800000;
          auVar29._0_8_ = 0x3f8000003f800000;
          auVar38._8_8_ = uStack_2410;
          auVar38._0_8_ = local_2418;
          auVar9 = vsubps_avx(ZEXT816(0),auVar38);
          auVar37._8_4_ = 0x42b0c0a5;
          auVar37._0_8_ = 0x42b0c0a542b0c0a5;
          auVar37._12_4_ = 0x42b0c0a5;
          auVar9 = vminps_avx(auVar9,auVar37);
          auVar36._8_4_ = 0xc2b0c0a5;
          auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar36._12_4_ = 0xc2b0c0a5;
          auVar7 = vmaxps_avx(auVar9,auVar36);
          local_1388 = auVar7._0_4_;
          fStack_1384 = auVar7._4_4_;
          fStack_1380 = auVar7._8_4_;
          fStack_137c = auVar7._12_4_;
          fVar110 = local_1388 * 1.442695 + 0.5;
          fVar111 = fStack_1384 * 1.442695 + 0.5;
          fVar112 = fStack_1380 * 1.442695 + 0.5;
          fVar113 = fStack_137c * 1.442695 + 0.5;
          local_1498 = CONCAT44(fVar111,fVar110);
          uStack_1490._0_4_ = fVar112;
          uStack_1490._4_4_ = fVar113;
          local_14a8 = CONCAT44((int)fVar111,(int)fVar110);
          uStack_14a0._0_4_ = (int)fVar112;
          uStack_14a0._4_4_ = (int)fVar113;
          auVar39._8_8_ = uStack_14a0;
          auVar39._0_8_ = local_14a8;
          auVar6 = vcvtdq2ps_avx(auVar39);
          auVar41._8_8_ = uStack_1490;
          auVar41._0_8_ = local_1498;
          auVar9 = vcmpps_avx(auVar41,auVar6,1);
          auVar43._8_8_ = 0x3f8000003f800000;
          auVar43._0_8_ = 0x3f8000003f800000;
          auVar9 = vpand_avx(auVar9,auVar43);
          auVar9 = vsubps_avx(auVar6,auVar9);
          auVar61._8_4_ = 0.6933594;
          auVar61._12_4_ = 0.6933594;
          auVar61._0_4_ = 0.6933594;
          auVar61._4_4_ = 0.6933594;
          auVar6 = vfnmadd213ps_fma(auVar61,auVar9,auVar7);
          auVar62._8_4_ = -0.00021219444;
          auVar62._12_4_ = -0.00021219444;
          auVar62._0_4_ = -0.00021219444;
          auVar62._4_4_ = -0.00021219444;
          auVar7 = vfnmadd213ps_fma(auVar62,auVar9,auVar6);
          local_13a8 = auVar7._0_4_;
          fStack_13a4 = auVar7._4_4_;
          fStack_13a0 = auVar7._8_4_;
          fStack_139c = auVar7._12_4_;
          local_1488._4_4_ = fStack_13a4 * fStack_13a4;
          local_1488._0_4_ = local_13a8 * local_13a8;
          fStack_1480 = fStack_13a0 * fStack_13a0;
          fStack_147c = fStack_139c * fStack_139c;
          local_14d8._8_4_ = 0x39506967;
          local_14d8._0_8_ = 0x3950696739506967;
          local_14d8._12_4_ = 0x39506967;
          auVar49._8_4_ = 0.0013981999;
          auVar49._12_4_ = 0.0013981999;
          auVar49._0_4_ = 0.0013981999;
          auVar49._4_4_ = 0.0013981999;
          auVar6 = vfmadd213ps_fma(auVar7,local_14d8,auVar49);
          auVar48._8_4_ = 0.008333452;
          auVar48._12_4_ = 0.008333452;
          auVar48._0_4_ = 0.008333452;
          auVar48._4_4_ = 0.008333452;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar48);
          auVar47._8_4_ = 0.041665796;
          auVar47._12_4_ = 0.041665796;
          auVar47._0_4_ = 0.041665796;
          auVar47._4_4_ = 0.041665796;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar47);
          auVar46._8_4_ = 0.16666666;
          auVar46._12_4_ = 0.16666666;
          auVar46._0_4_ = 0.16666666;
          auVar46._4_4_ = 0.16666666;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar46);
          auVar45._8_4_ = 0.5;
          auVar45._12_4_ = 0.5;
          auVar45._0_4_ = 0.5;
          auVar45._4_4_ = 0.5;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar45);
          auVar6 = vfmadd213ps_fma(_local_1488,auVar6,auVar7);
          local_1448 = auVar6._0_4_;
          fStack_1444 = auVar6._4_4_;
          fStack_1440 = auVar6._8_4_;
          fStack_143c = auVar6._12_4_;
          local_1318 = auVar9._0_4_;
          fStack_1314 = auVar9._4_4_;
          fStack_1310 = auVar9._8_4_;
          fStack_130c = auVar9._12_4_;
          local_14a8 = CONCAT44((int)fStack_1314,(int)local_1318);
          uStack_14a0._0_4_ = (int)fStack_1310;
          uStack_14a0._4_4_ = (int)fStack_130c;
          auVar56._8_8_ = uStack_14a0;
          auVar56._0_8_ = local_14a8;
          auVar55._8_8_ = 0x7f0000007f;
          auVar55._0_8_ = 0x7f0000007f;
          auVar9 = vpaddd_avx(auVar56,auVar55);
          auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
          local_13d8 = auVar9._0_4_;
          fStack_13d4 = auVar9._4_4_;
          fStack_13d0 = auVar9._8_4_;
          fStack_13cc = auVar9._12_4_;
          auVar32._4_4_ = (fStack_1444 + 1.0) * fStack_13d4 + 1.0;
          auVar32._0_4_ = (local_1448 + 1.0) * local_13d8 + 1.0;
          auVar32._8_4_ = (fStack_1440 + 1.0) * fStack_13d0 + 1.0;
          auVar32._12_4_ = (fStack_143c + 1.0) * fStack_13cc + 1.0;
          _local_1ab8 = vdivps_avx(auVar29,auVar32);
          break;
        case 5:
          auVar35._8_8_ = uStack_2410;
          auVar35._0_8_ = local_2418;
          auVar34._8_4_ = 0x42b0c0a5;
          auVar34._0_8_ = 0x42b0c0a542b0c0a5;
          auVar34._12_4_ = 0x42b0c0a5;
          auVar9 = vminps_avx(auVar35,auVar34);
          auVar33._8_4_ = 0xc2b0c0a5;
          auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar33._12_4_ = 0xc2b0c0a5;
          auVar7 = vmaxps_avx(auVar9,auVar33);
          local_14f8 = auVar7._0_4_;
          fStack_14f4 = auVar7._4_4_;
          fStack_14f0 = auVar7._8_4_;
          fStack_14ec = auVar7._12_4_;
          fVar110 = local_14f8 * 1.442695 + 0.5;
          fVar111 = fStack_14f4 * 1.442695 + 0.5;
          fVar112 = fStack_14f0 * 1.442695 + 0.5;
          fVar113 = fStack_14ec * 1.442695 + 0.5;
          local_1608 = CONCAT44(fVar111,fVar110);
          uStack_1600._0_4_ = fVar112;
          uStack_1600._4_4_ = fVar113;
          local_1618 = CONCAT44((int)fVar111,(int)fVar110);
          uStack_1610._0_4_ = (int)fVar112;
          uStack_1610._4_4_ = (int)fVar113;
          auVar40._8_8_ = uStack_1610;
          auVar40._0_8_ = local_1618;
          auVar6 = vcvtdq2ps_avx(auVar40);
          auVar42._8_8_ = uStack_1600;
          auVar42._0_8_ = local_1608;
          auVar9 = vcmpps_avx(auVar42,auVar6,1);
          auVar44._8_8_ = 0x3f8000003f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar9 = vpand_avx(auVar9,auVar44);
          auVar9 = vsubps_avx(auVar6,auVar9);
          auVar59._8_4_ = 0.6933594;
          auVar59._12_4_ = 0.6933594;
          auVar59._0_4_ = 0.6933594;
          auVar59._4_4_ = 0.6933594;
          auVar6 = vfnmadd213ps_fma(auVar59,auVar9,auVar7);
          auVar60._8_4_ = -0.00021219444;
          auVar60._12_4_ = -0.00021219444;
          auVar60._0_4_ = -0.00021219444;
          auVar60._4_4_ = -0.00021219444;
          auVar7 = vfnmadd213ps_fma(auVar60,auVar9,auVar6);
          local_1518 = auVar7._0_4_;
          fStack_1514 = auVar7._4_4_;
          fStack_1510 = auVar7._8_4_;
          fStack_150c = auVar7._12_4_;
          local_15f8._4_4_ = fStack_1514 * fStack_1514;
          local_15f8._0_4_ = local_1518 * local_1518;
          fStack_15f0 = fStack_1510 * fStack_1510;
          fStack_15ec = fStack_150c * fStack_150c;
          local_1648._8_4_ = 0x39506967;
          local_1648._0_8_ = 0x3950696739506967;
          local_1648._12_4_ = 0x39506967;
          auVar54._8_4_ = 0.0013981999;
          auVar54._12_4_ = 0.0013981999;
          auVar54._0_4_ = 0.0013981999;
          auVar54._4_4_ = 0.0013981999;
          auVar6 = vfmadd213ps_fma(auVar7,local_1648,auVar54);
          auVar53._8_4_ = 0.008333452;
          auVar53._12_4_ = 0.008333452;
          auVar53._0_4_ = 0.008333452;
          auVar53._4_4_ = 0.008333452;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar53);
          auVar52._8_4_ = 0.041665796;
          auVar52._12_4_ = 0.041665796;
          auVar52._0_4_ = 0.041665796;
          auVar52._4_4_ = 0.041665796;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar52);
          auVar51._8_4_ = 0.16666666;
          auVar51._12_4_ = 0.16666666;
          auVar51._0_4_ = 0.16666666;
          auVar51._4_4_ = 0.16666666;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar51);
          auVar50._8_4_ = 0.5;
          auVar50._12_4_ = 0.5;
          auVar50._0_4_ = 0.5;
          auVar50._4_4_ = 0.5;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar50);
          auVar6 = vfmadd213ps_fma(_local_15f8,auVar6,auVar7);
          local_15b8 = auVar6._0_4_;
          fStack_15b4 = auVar6._4_4_;
          fStack_15b0 = auVar6._8_4_;
          fStack_15ac = auVar6._12_4_;
          local_12f8 = auVar9._0_4_;
          fStack_12f4 = auVar9._4_4_;
          fStack_12f0 = auVar9._8_4_;
          fStack_12ec = auVar9._12_4_;
          local_1618 = CONCAT44((int)fStack_12f4,(int)local_12f8);
          uStack_1610._0_4_ = (int)fStack_12f0;
          uStack_1610._4_4_ = (int)fStack_12ec;
          auVar58._8_8_ = uStack_1610;
          auVar58._0_8_ = local_1618;
          auVar57._8_8_ = 0x7f0000007f;
          auVar57._0_8_ = 0x7f0000007f;
          auVar9 = vpaddd_avx(auVar58,auVar57);
          auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
          local_1548 = auVar9._0_4_;
          fStack_1544 = auVar9._4_4_;
          fStack_1540 = auVar9._8_4_;
          fStack_153c = auVar9._12_4_;
          local_5f8._4_4_ = (fStack_15b4 + 1.0) * fStack_1544 + 1.0;
          local_5f8._0_4_ = (local_15b8 + 1.0) * local_1548 + 1.0;
          uStack_5f0._0_4_ = (fStack_15b0 + 1.0) * fStack_1540 + 1.0;
          uStack_5f0._4_4_ = (fStack_15ac + 1.0) * fStack_153c + 1.0;
          auVar98._8_8_ = uStack_5f0;
          auVar98._0_8_ = local_5f8;
          auVar9 = vcmpps_avx(auVar98,ZEXT816(0),2);
          auVar82._8_8_ = uStack_5f0;
          auVar82._0_8_ = local_5f8;
          auVar81._8_4_ = 0x800000;
          auVar81._0_8_ = 0x80000000800000;
          auVar81._12_4_ = 0x800000;
          auVar6 = vmaxps_avx(auVar82,auVar81);
          auVar7 = vpsrld_avx(auVar6,ZEXT416(0x17));
          auVar86._8_4_ = 0x807fffff;
          auVar86._0_8_ = 0x807fffff807fffff;
          auVar86._12_4_ = 0x807fffff;
          auVar6 = vpand_avx(auVar6,auVar86);
          auVar99._8_4_ = 0x3f000000;
          auVar99._0_8_ = 0x3f0000003f000000;
          auVar99._12_4_ = 0x3f000000;
          auVar8 = vpor_avx(auVar6,auVar99);
          auVar100._8_8_ = 0x7f0000007f;
          auVar100._0_8_ = 0x7f0000007f;
          auVar6 = vpsubd_avx(auVar7,auVar100);
          auVar6 = vcvtdq2ps_avx(auVar6);
          local_588 = auVar6._0_4_;
          fStack_584 = auVar6._4_4_;
          fStack_580 = auVar6._8_4_;
          fStack_57c = auVar6._12_4_;
          local_638 = CONCAT44(fStack_584 + 1.0,local_588 + 1.0);
          uStack_630._0_4_ = fStack_580 + 1.0;
          uStack_630._4_4_ = fStack_57c + 1.0;
          auVar101._8_4_ = 0x3f3504f3;
          auVar101._0_8_ = 0x3f3504f33f3504f3;
          auVar101._12_4_ = 0x3f3504f3;
          auVar6 = vcmpps_avx(auVar8,auVar101,1);
          auVar7 = vpand_avx(auVar8,auVar6);
          auVar84._8_8_ = 0x3f8000003f800000;
          auVar84._0_8_ = 0x3f8000003f800000;
          auVar8 = vsubps_avx(auVar8,auVar84);
          auVar85._8_8_ = 0x3f8000003f800000;
          auVar85._0_8_ = 0x3f8000003f800000;
          auVar6 = vpand_avx(auVar6,auVar85);
          auVar83._8_8_ = uStack_630;
          auVar83._0_8_ = local_638;
          auVar6 = vsubps_avx(auVar83,auVar6);
          local_5a8 = auVar8._0_4_;
          fStack_5a4 = auVar8._4_4_;
          fStack_5a0 = auVar8._8_4_;
          fStack_59c = auVar8._12_4_;
          local_5b8 = auVar7._0_4_;
          fStack_5b4 = auVar7._4_4_;
          fStack_5b0 = auVar7._8_4_;
          fStack_5ac = auVar7._12_4_;
          local_5f8._0_4_ = local_5a8 + local_5b8;
          local_5f8._4_4_ = fStack_5a4 + fStack_5b4;
          uStack_5f0._0_4_ = fStack_5a0 + fStack_5b0;
          uStack_5f0._4_4_ = fStack_59c + fStack_5ac;
          fStack_670 = 0.070376836;
          local_678 = (undefined1  [8])0x3d9021bb3d9021bb;
          fStack_66c = 0.070376836;
          auVar96._8_4_ = -0.1151461;
          auVar96._12_4_ = -0.1151461;
          auVar96._0_4_ = -0.1151461;
          auVar96._4_4_ = -0.1151461;
          auVar7 = vfmadd213ps_fma(_local_5f8,_local_678,auVar96);
          auVar95._8_4_ = 0.116769984;
          auVar95._12_4_ = 0.116769984;
          auVar95._0_4_ = 0.116769984;
          auVar95._4_4_ = 0.116769984;
          auVar7 = vfmadd213ps_fma(_local_5f8,auVar7,auVar95);
          auVar94._8_4_ = -0.12420141;
          auVar94._12_4_ = -0.12420141;
          auVar94._0_4_ = -0.12420141;
          auVar94._4_4_ = -0.12420141;
          auVar7 = vfmadd213ps_fma(_local_5f8,auVar7,auVar94);
          auVar93._8_4_ = 0.14249323;
          auVar93._12_4_ = 0.14249323;
          auVar93._0_4_ = 0.14249323;
          auVar93._4_4_ = 0.14249323;
          auVar7 = vfmadd213ps_fma(_local_5f8,auVar7,auVar93);
          auVar92._8_4_ = -0.16668057;
          auVar92._12_4_ = -0.16668057;
          auVar92._0_4_ = -0.16668057;
          auVar92._4_4_ = -0.16668057;
          auVar7 = vfmadd213ps_fma(_local_5f8,auVar7,auVar92);
          auVar91._8_4_ = 0.20000714;
          auVar91._12_4_ = 0.20000714;
          auVar91._0_4_ = 0.20000714;
          auVar91._4_4_ = 0.20000714;
          auVar7 = vfmadd213ps_fma(_local_5f8,auVar7,auVar91);
          auVar90._8_4_ = -0.24999994;
          auVar90._12_4_ = -0.24999994;
          auVar90._0_4_ = -0.24999994;
          auVar90._4_4_ = -0.24999994;
          auVar7 = vfmadd213ps_fma(_local_5f8,auVar7,auVar90);
          auVar89._8_4_ = 0.3333333;
          auVar89._12_4_ = 0.3333333;
          auVar89._0_4_ = 0.3333333;
          auVar89._4_4_ = 0.3333333;
          auVar7 = vfmadd213ps_fma(_local_5f8,auVar7,auVar89);
          local_528 = auVar7._0_4_;
          fStack_524 = auVar7._4_4_;
          fStack_520 = auVar7._8_4_;
          fStack_51c = auVar7._12_4_;
          local_678._4_4_ =
               fStack_524 * (float)local_5f8._4_4_ * (float)local_5f8._4_4_ * (float)local_5f8._4_4_
          ;
          local_678._0_4_ =
               local_528 * (float)local_5f8._0_4_ * (float)local_5f8._0_4_ * (float)local_5f8._0_4_;
          fStack_670 = fStack_520 * (float)uStack_5f0 * (float)uStack_5f0 * (float)uStack_5f0;
          fStack_66c = fStack_51c * uStack_5f0._4_4_ * uStack_5f0._4_4_ * uStack_5f0._4_4_;
          auVar88._8_4_ = -0.00021219444;
          auVar88._12_4_ = -0.00021219444;
          auVar88._0_4_ = -0.00021219444;
          auVar88._4_4_ = -0.00021219444;
          auVar7 = vfmadd213ps_fma(auVar88,auVar6,_local_678);
          auVar102._4_4_ = (float)local_5f8._4_4_ * (float)local_5f8._4_4_;
          auVar102._0_4_ = (float)local_5f8._0_4_ * (float)local_5f8._0_4_;
          auVar102._8_4_ = (float)uStack_5f0 * (float)uStack_5f0;
          auVar102._12_4_ = uStack_5f0._4_4_ * uStack_5f0._4_4_;
          auVar97._8_4_ = 0.5;
          auVar97._12_4_ = 0.5;
          auVar97._0_4_ = 0.5;
          auVar97._4_4_ = 0.5;
          auVar7 = vfnmadd213ps_fma(auVar97,auVar102,auVar7);
          local_5d8 = auVar7._0_4_;
          fStack_5d4 = auVar7._4_4_;
          fStack_5d0 = auVar7._8_4_;
          fStack_5cc = auVar7._12_4_;
          local_5f8._4_4_ = (float)local_5f8._4_4_ + fStack_5d4;
          local_5f8._0_4_ = (float)local_5f8._0_4_ + local_5d8;
          uStack_5f0._0_4_ = (float)uStack_5f0 + fStack_5d0;
          uStack_5f0._4_4_ = uStack_5f0._4_4_ + fStack_5cc;
          auVar87._8_4_ = 0.6933594;
          auVar87._12_4_ = 0.6933594;
          auVar87._0_4_ = 0.6933594;
          auVar87._4_4_ = 0.6933594;
          auVar6 = vfmadd213ps_fma(auVar87,auVar6,_local_5f8);
          auVar9 = vpor_avx(auVar6,auVar9);
          local_ba8 = auVar9._0_4_;
          fStack_ba4 = auVar9._4_4_;
          fStack_ba0 = auVar9._8_4_;
          fStack_b9c = auVar9._12_4_;
          auVar67._4_4_ = fStack_ba4 * 2.0;
          auVar67._0_4_ = local_ba8 * 2.0;
          auVar67._12_4_ = fStack_b9c * 2.0;
          auVar67._8_4_ = fStack_ba0 * 2.0;
          auVar9 = vsubps_avx(ZEXT816(0),auVar67);
          auVar66._8_4_ = 0x42b0c0a5;
          auVar66._0_8_ = 0x42b0c0a542b0c0a5;
          auVar66._12_4_ = 0x42b0c0a5;
          auVar9 = vminps_avx(auVar9,auVar66);
          auVar65._8_4_ = 0xc2b0c0a5;
          auVar65._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar65._12_4_ = 0xc2b0c0a5;
          auVar7 = vmaxps_avx(auVar65,auVar9);
          local_a18 = auVar7._0_4_;
          fStack_a14 = auVar7._4_4_;
          fStack_a10 = auVar7._8_4_;
          fStack_a0c = auVar7._12_4_;
          fVar110 = local_a18 * 1.442695 + 0.5;
          fVar111 = fStack_a14 * 1.442695 + 0.5;
          fVar112 = fStack_a10 * 1.442695 + 0.5;
          fVar113 = fStack_a0c * 1.442695 + 0.5;
          local_b28 = CONCAT44(fVar111,fVar110);
          uStack_b20._0_4_ = fVar112;
          uStack_b20._4_4_ = fVar113;
          local_b38 = CONCAT44((int)fVar111,(int)fVar110);
          uStack_b30._0_4_ = (int)fVar112;
          uStack_b30._4_4_ = (int)fVar113;
          auVar69._8_8_ = uStack_b30;
          auVar69._0_8_ = local_b38;
          auVar6 = vcvtdq2ps_avx(auVar69);
          auVar70._8_8_ = uStack_b20;
          auVar70._0_8_ = local_b28;
          auVar9 = vcmpps_avx(auVar70,auVar6,1);
          auVar71._8_8_ = 0x3f8000003f800000;
          auVar71._0_8_ = 0x3f8000003f800000;
          auVar9 = vpand_avx(auVar9,auVar71);
          auVar9 = vsubps_avx(auVar6,auVar9);
          auVar79._8_4_ = 0.6933594;
          auVar79._12_4_ = 0.6933594;
          auVar79._0_4_ = 0.6933594;
          auVar79._4_4_ = 0.6933594;
          auVar6 = vfnmadd213ps_fma(auVar79,auVar9,auVar7);
          auVar80._8_4_ = -0.00021219444;
          auVar80._12_4_ = -0.00021219444;
          auVar80._0_4_ = -0.00021219444;
          auVar80._4_4_ = -0.00021219444;
          auVar7 = vfnmadd213ps_fma(auVar80,auVar9,auVar6);
          local_a38 = auVar7._0_4_;
          fStack_a34 = auVar7._4_4_;
          fStack_a30 = auVar7._8_4_;
          fStack_a2c = auVar7._12_4_;
          local_b18._4_4_ = fStack_a34 * fStack_a34;
          local_b18._0_4_ = local_a38 * local_a38;
          fStack_b10 = fStack_a30 * fStack_a30;
          fStack_b0c = fStack_a2c * fStack_a2c;
          local_b68._8_4_ = 0x39506967;
          local_b68._0_8_ = 0x3950696739506967;
          local_b68._12_4_ = 0x39506967;
          auVar76._8_4_ = 0.0013981999;
          auVar76._12_4_ = 0.0013981999;
          auVar76._0_4_ = 0.0013981999;
          auVar76._4_4_ = 0.0013981999;
          auVar6 = vfmadd213ps_fma(auVar7,local_b68,auVar76);
          auVar75._8_4_ = 0.008333452;
          auVar75._12_4_ = 0.008333452;
          auVar75._0_4_ = 0.008333452;
          auVar75._4_4_ = 0.008333452;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar75);
          auVar74._8_4_ = 0.041665796;
          auVar74._12_4_ = 0.041665796;
          auVar74._0_4_ = 0.041665796;
          auVar74._4_4_ = 0.041665796;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar74);
          auVar73._8_4_ = 0.16666666;
          auVar73._12_4_ = 0.16666666;
          auVar73._0_4_ = 0.16666666;
          auVar73._4_4_ = 0.16666666;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar73);
          auVar72._8_4_ = 0.5;
          auVar72._12_4_ = 0.5;
          auVar72._0_4_ = 0.5;
          auVar72._4_4_ = 0.5;
          auVar6 = vfmadd213ps_fma(auVar7,auVar6,auVar72);
          auVar6 = vfmadd213ps_fma(_local_b18,auVar6,auVar7);
          local_ad8 = auVar6._0_4_;
          fStack_ad4 = auVar6._4_4_;
          fStack_ad0 = auVar6._8_4_;
          fStack_acc = auVar6._12_4_;
          local_9a8 = auVar9._0_4_;
          fStack_9a4 = auVar9._4_4_;
          fStack_9a0 = auVar9._8_4_;
          fStack_99c = auVar9._12_4_;
          local_b38 = CONCAT44((int)fStack_9a4,(int)local_9a8);
          uStack_b30._0_4_ = (int)fStack_9a0;
          uStack_b30._4_4_ = (int)fStack_99c;
          auVar78._8_8_ = uStack_b30;
          auVar78._0_8_ = local_b38;
          auVar77._8_8_ = 0x7f0000007f;
          auVar77._0_8_ = 0x7f0000007f;
          auVar9 = vpaddd_avx(auVar78,auVar77);
          auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
          local_a68 = auVar9._0_4_;
          fStack_a64 = auVar9._4_4_;
          fStack_a60 = auVar9._8_4_;
          fStack_a5c = auVar9._12_4_;
          auVar64._8_8_ = 0x3f8000003f800000;
          auVar64._0_8_ = 0x3f8000003f800000;
          auVar63._4_4_ = (fStack_ad4 + 1.0) * fStack_a64 + 1.0;
          auVar63._0_4_ = (local_ad8 + 1.0) * local_a68 + 1.0;
          auVar63._8_4_ = (fStack_ad0 + 1.0) * fStack_a60 + 1.0;
          auVar63._12_4_ = (fStack_acc + 1.0) * fStack_a5c + 1.0;
          auVar9 = vdivps_avx(auVar64,auVar63);
          local_bc8 = auVar9._0_4_;
          fStack_bc4 = auVar9._4_4_;
          fStack_bc0 = auVar9._8_4_;
          fStack_bbc = auVar9._12_4_;
          auVar114._0_4_ = local_bc8 * 2.0;
          auVar114._4_4_ = fStack_bc4 * 2.0;
          auVar114._8_4_ = fStack_bc0 * 2.0;
          auVar114._12_4_ = fStack_bbc * 2.0;
          auVar68._8_8_ = 0x3f8000003f800000;
          auVar68._0_8_ = 0x3f8000003f800000;
          auVar9 = vsubps_avx(auVar114,auVar68);
          local_16b8 = auVar9._0_4_;
          fStack_16b4 = auVar9._4_4_;
          fStack_16b0 = auVar9._8_4_;
          fStack_16ac = auVar9._12_4_;
          local_1ab8._4_4_ = fStack_16f4 * fStack_16b4;
          local_1ab8._0_4_ = local_16f8 * local_16b8;
          uStack_1ab0._0_4_ = fStack_16a0 * fStack_16b0;
          uStack_1ab0._4_4_ = fStack_169c * fStack_16ac;
          break;
        case 6:
          fVar110 = *(float *)*in_stack_00000030;
          fVar111 = *(float *)(*in_stack_00000030 + 4);
          local_17b8 = CONCAT44(fStack_16f4 * fVar110 + fVar111,local_16f8 * fVar110 + fVar111);
          uStack_17b0._0_4_ = fStack_16a0 * fVar110 + fVar111;
          uStack_17b0._4_4_ = fStack_169c * fVar110 + fVar111;
          auVar30._8_8_ = uStack_17b0;
          auVar30._0_8_ = local_17b8;
          auVar9 = vmaxps_avx(auVar30,ZEXT816(0));
          auVar31._8_8_ = 0x3f8000003f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar9 = vminps_avx(auVar9,auVar31);
          local_16e8 = auVar9._0_4_;
          fStack_16e4 = auVar9._4_4_;
          fStack_16e0 = auVar9._8_4_;
          fStack_16dc = auVar9._12_4_;
          local_1ab8._4_4_ = fStack_16e4 * fStack_16f4;
          local_1ab8._0_4_ = local_16e8 * local_16f8;
          uStack_1ab0._0_4_ = fStack_16e0 * fStack_16a0;
          uStack_1ab0._4_4_ = fStack_16dc * fStack_169c;
          break;
        default:
          uStack_1ab0 = uStack_2410;
          local_1ab8 = (undefined1  [8])local_2418;
        }
        *local_2390 = local_1ab8;
        local_2390[1] = uStack_1ab0;
        local_2390 = local_2390 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack16to4_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 16;

                            int k = (y * kernel_w + x) * 64;

                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);
                            __m128 _val8 = _mm_broadcast_ss(sptr + 8);
                            __m128 _val9 = _mm_broadcast_ss(sptr + 9);
                            __m128 _vala = _mm_broadcast_ss(sptr + 10);
                            __m128 _valb = _mm_broadcast_ss(sptr + 11);
                            __m128 _valc = _mm_broadcast_ss(sptr + 12);
                            __m128 _vald = _mm_broadcast_ss(sptr + 13);
                            __m128 _vale = _mm_broadcast_ss(sptr + 14);
                            __m128 _valf = _mm_broadcast_ss(sptr + 15);
                            __m128 _w0 = _mm_load_ps(kptr + k);
                            __m128 _w1 = _mm_load_ps(kptr + k + 4);
                            __m128 _w2 = _mm_load_ps(kptr + k + 8);
                            __m128 _w3 = _mm_load_ps(kptr + k + 12);
                            __m128 _w4 = _mm_load_ps(kptr + k + 16);
                            __m128 _w5 = _mm_load_ps(kptr + k + 20);
                            __m128 _w6 = _mm_load_ps(kptr + k + 24);
                            __m128 _w7 = _mm_load_ps(kptr + k + 28);
                            __m128 _w8 = _mm_load_ps(kptr + k + 32);
                            __m128 _w9 = _mm_load_ps(kptr + k + 36);
                            __m128 _wa = _mm_load_ps(kptr + k + 40);
                            __m128 _wb = _mm_load_ps(kptr + k + 44);
                            __m128 _wc = _mm_load_ps(kptr + k + 48);
                            __m128 _wd = _mm_load_ps(kptr + k + 52);
                            __m128 _we = _mm_load_ps(kptr + k + 56);
                            __m128 _wf = _mm_load_ps(kptr + k + 60);
                            _sum = _mm_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm_fmadd_ps(_val7, _w7, _sum);
                            _sum = _mm_fmadd_ps(_val8, _w8, _sum);
                            _sum = _mm_fmadd_ps(_val9, _w9, _sum);
                            _sum = _mm_fmadd_ps(_vala, _wa, _sum);
                            _sum = _mm_fmadd_ps(_valb, _wb, _sum);
                            _sum = _mm_fmadd_ps(_valc, _wc, _sum);
                            _sum = _mm_fmadd_ps(_vald, _wd, _sum);
                            _sum = _mm_fmadd_ps(_vale, _we, _sum);
                            _sum = _mm_fmadd_ps(_valf, _wf, _sum);
                        }
                    }

                    kptr += maxk * 64;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}